

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

void xmlBufDumpEntityDecl(xmlBufPtr buf,xmlEntityPtr ent)

{
  xmlBufferPtr buf_00;
  
  buf_00 = xmlBufferCreate();
  if (buf_00 != (xmlBufferPtr)0x0) {
    xmlBufferSetAllocationScheme(buf_00,XML_BUFFER_ALLOC_DOUBLEIT);
    xmlDumpEntityDecl(buf_00,ent);
    xmlBufMergeBuffer(buf,buf_00);
    return;
  }
  return;
}

Assistant:

static void
xmlBufDumpEntityDecl(xmlBufPtr buf, xmlEntityPtr ent) {
    xmlBufferPtr buffer;

    buffer = xmlBufferCreate();
    if (buffer == NULL) {
        /*
         * TODO set the error in buf
         */
        return;
    }
    xmlBufferSetAllocationScheme(buffer, XML_BUFFER_ALLOC_DOUBLEIT);
    xmlDumpEntityDecl(buffer, ent);
    xmlBufMergeBuffer(buf, buffer);
}